

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

SchemaCatalogEntry * __thiscall duckdb::Binder::BindSchema(Binder *this,CreateInfo *info)

{
  string *catalog;
  string *schema;
  bool bVar1;
  int iVar2;
  ClientData *pCVar3;
  pointer pCVar4;
  ParserException *pPVar5;
  SchemaCatalogEntry *pSVar6;
  StatementProperties *this_00;
  string *this_01;
  unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
  *this_02;
  string local_50;
  
  catalog = &info->catalog;
  schema = &info->schema;
  BindSchemaOrCatalog(this->context,catalog,schema);
  bVar1 = IsInvalidCatalog(catalog);
  if ((bVar1) && (info->temporary == true)) {
    ::std::__cxx11::string::_M_replace
              ((ulong)catalog,0,(char *)(info->catalog)._M_string_length,0x1327bc4);
  }
  pCVar3 = ClientData::Get(this->context);
  this_02 = &pCVar3->catalog_search_path;
  bVar1 = IsInvalidCatalog(catalog);
  if (bVar1) {
    bVar1 = IsInvalidSchema(schema);
    if (bVar1) {
      pCVar4 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
               ::operator->(this_02);
      CatalogSearchPath::GetDefault(pCVar4);
      ::std::__cxx11::string::_M_assign((string *)catalog);
      ::std::__cxx11::string::_M_assign((string *)schema);
      goto LAB_006df051;
    }
  }
  bVar1 = IsInvalidSchema(schema);
  if (bVar1) {
    pCVar4 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator->(this_02);
    CatalogSearchPath::GetDefaultSchema(&local_50,pCVar4,this->context,catalog);
    this_01 = (string *)schema;
  }
  else {
    bVar1 = IsInvalidCatalog(catalog);
    if (!bVar1) goto LAB_006df051;
    pCVar4 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator->(this_02);
    CatalogSearchPath::GetDefaultCatalog(&local_50,pCVar4,schema);
    this_01 = (string *)catalog;
  }
  ::std::__cxx11::string::operator=(this_01,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_006df051:
  bVar1 = IsInvalidCatalog(catalog);
  if (bVar1) {
    DatabaseManager::GetDefaultDatabase_abi_cxx11_(this->context);
    ::std::__cxx11::string::_M_assign((string *)catalog);
  }
  bVar1 = info->temporary;
  iVar2 = ::std::__cxx11::string::compare((char *)catalog);
  if (bVar1 == false) {
    if (iVar2 == 0) {
      pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Only TEMPORARY table names can use the \"%s\" catalog","");
      ParserException::ParserException<char_const*>(pPVar5,&local_50,"temp");
      __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (iVar2 != 0) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"TEMPORARY table names can *only* use the \"%s\" catalog","");
    ParserException::ParserException<char_const*>(pPVar5,&local_50,"temp");
    __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar6 = Catalog::GetSchema(this->context,catalog,schema);
  ::std::__cxx11::string::_M_assign((string *)schema);
  if (info->temporary == false) {
    this_00 = GetStatementProperties(this);
    StatementProperties::RegisterDBModify
              (this_00,(pSVar6->super_InCatalogEntry).catalog,this->context);
  }
  return pSVar6;
}

Assistant:

SchemaCatalogEntry &Binder::BindSchema(CreateInfo &info) {
	BindSchemaOrCatalog(info.catalog, info.schema);
	if (IsInvalidCatalog(info.catalog) && info.temporary) {
		info.catalog = TEMP_CATALOG;
	}
	auto &search_path = ClientData::Get(context).catalog_search_path;
	if (IsInvalidCatalog(info.catalog) && IsInvalidSchema(info.schema)) {
		auto &default_entry = search_path->GetDefault();
		info.catalog = default_entry.catalog;
		info.schema = default_entry.schema;
	} else if (IsInvalidSchema(info.schema)) {
		info.schema = search_path->GetDefaultSchema(context, info.catalog);
	} else if (IsInvalidCatalog(info.catalog)) {
		info.catalog = search_path->GetDefaultCatalog(info.schema);
	}
	if (IsInvalidCatalog(info.catalog)) {
		info.catalog = DatabaseManager::GetDefaultDatabase(context);
	}
	if (!info.temporary) {
		// non-temporary create: not read only
		if (info.catalog == TEMP_CATALOG) {
			throw ParserException("Only TEMPORARY table names can use the \"%s\" catalog", TEMP_CATALOG);
		}
	} else {
		if (info.catalog != TEMP_CATALOG) {
			throw ParserException("TEMPORARY table names can *only* use the \"%s\" catalog", TEMP_CATALOG);
		}
	}
	// fetch the schema in which we want to create the object
	auto &schema_obj = Catalog::GetSchema(context, info.catalog, info.schema);
	D_ASSERT(schema_obj.type == CatalogType::SCHEMA_ENTRY);
	info.schema = schema_obj.name;
	if (!info.temporary) {
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(schema_obj.catalog, context);
	}
	return schema_obj;
}